

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

void __thiscall
crnlib::Resampler::Resampler
          (Resampler *this,int src_x,int src_y,int dst_x,int dst_y,Boundary_Op boundary_op,
          Resample_Real sample_low,Resample_Real sample_high,char *Pfilter_name,
          Contrib_List *Pclist_x,Contrib_List *Pclist_y,Resample_Real filter_x_scale,
          Resample_Real filter_y_scale,Resample_Real src_x_ofs,Resample_Real src_y_ofs)

{
  Resample_Real filter_support;
  int iVar1;
  int iVar2;
  _func_Resample_Real_Resample_Real *Pfilter;
  bool bVar3;
  int iVar4;
  Sample *pSVar5;
  Contrib_List *pCVar6;
  int *piVar7;
  uchar *puVar8;
  Scan_Buf *pSVar9;
  Status SVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  char *__s1;
  char *__s2;
  
  this->m_lo = sample_low;
  this->m_hi = sample_high;
  this->m_intermediate_x = 0;
  this->m_status = STATUS_OKAY;
  this->m_Pdst_buf = (Sample *)0x0;
  this->m_Ptmp_buf = (Sample *)0x0;
  this->m_Pclist_x = (Contrib_List *)0x0;
  this->m_Pclist_y = (Contrib_List *)0x0;
  *(undefined4 *)((long)&this->m_Pclist_y + 7) = 0;
  this->m_Psrc_y_count = (int *)0x0;
  this->m_Psrc_y_flag = (uchar *)0x0;
  this->m_Pscan_buf = (Scan_Buf *)0x0;
  this->m_resample_src_x = src_x;
  this->m_resample_src_y = src_y;
  this->m_resample_dst_x = dst_x;
  this->m_resample_dst_y = dst_y;
  this->m_boundary_op = boundary_op;
  pSVar5 = (Sample *)crnlib_malloc((long)dst_x << 2);
  this->m_Pdst_buf = pSVar5;
  if (pSVar5 != (Sample *)0x0) {
    __s1 = "lanczos4";
    if (Pfilter_name != (char *)0x0) {
      __s1 = Pfilter_name;
    }
    __s2 = "box";
    uVar15 = 0;
    do {
      iVar4 = strcmp(__s1,__s2);
      if (iVar4 == 0) goto LAB_00152a15;
      uVar15 = uVar15 + 1;
      __s2 = __s2 + 0x30;
    } while (uVar15 != 0x10);
    uVar15 = 0x10;
LAB_00152a15:
    SVar10 = STATUS_BAD_FILTER_NAME;
    if ((int)uVar15 == 0x10) goto LAB_00152c90;
    lVar11 = (uVar15 & 0xffffffff) * 0x30;
    Pfilter = *(_func_Resample_Real_Resample_Real **)(&DAT_001deaa0 + lVar11);
    filter_support = *(Resample_Real *)(&DAT_001deaa8 + lVar11);
    if (Pclist_x == (Contrib_List *)0x0) {
      pCVar6 = make_clist(this->m_resample_src_x,this->m_resample_dst_x,this->m_boundary_op,Pfilter,
                          filter_support,filter_x_scale,src_x_ofs);
      this->m_Pclist_x = pCVar6;
      if (pCVar6 == (Contrib_List *)0x0) goto LAB_00152c8b;
    }
    else {
      this->m_Pclist_x = Pclist_x;
      this->m_clist_x_forced = true;
    }
    if (Pclist_y == (Contrib_List *)0x0) {
      pCVar6 = make_clist(this->m_resample_src_y,this->m_resample_dst_y,this->m_boundary_op,Pfilter,
                          filter_support,filter_y_scale,src_y_ofs);
      this->m_Pclist_y = pCVar6;
      if (pCVar6 == (Contrib_List *)0x0) goto LAB_00152c8b;
    }
    else {
      this->m_Pclist_y = Pclist_y;
      this->m_clist_y_forced = true;
    }
    piVar7 = (int *)crnlib_calloc((long)this->m_resample_src_y,4,(size_t *)0x0);
    this->m_Psrc_y_count = piVar7;
    if (piVar7 != (int *)0x0) {
      puVar8 = (uchar *)crnlib_calloc((long)this->m_resample_src_y,1,(size_t *)0x0);
      this->m_Psrc_y_flag = puVar8;
      if (puVar8 != (uchar *)0x0) {
        if (0 < this->m_resample_dst_y) {
          lVar11 = 0;
          do {
            pCVar6 = this->m_Pclist_y;
            if (pCVar6[lVar11].n != 0) {
              uVar15 = 0;
              do {
                this->m_Psrc_y_count[pCVar6[lVar11].p[uVar15].pixel] =
                     this->m_Psrc_y_count[pCVar6[lVar11].p[uVar15].pixel] + 1;
                uVar15 = uVar15 + 1;
                pCVar6 = this->m_Pclist_y;
              } while (uVar15 < pCVar6[lVar11].n);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < this->m_resample_dst_y);
        }
        pSVar9 = (Scan_Buf *)crnlib_malloc(0x30000);
        this->m_Pscan_buf = pSVar9;
        if (pSVar9 != (Scan_Buf *)0x0) {
          lVar11 = 0;
          do {
            this->m_Pscan_buf->scan_buf_y[lVar11] = -1;
            this->m_Pscan_buf->scan_buf_l[lVar11] = (Sample *)0x0;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x4000);
          this->m_cur_src_y = 0;
          this->m_cur_dst_y = 0;
          iVar4 = this->m_resample_dst_x;
          iVar13 = 0;
          iVar12 = 0;
          if (0 < (long)iVar4) {
            lVar11 = 0;
            iVar12 = 0;
            do {
              iVar12 = iVar12 + (uint)*(ushort *)((long)&this->m_Pclist_x->n + lVar11);
              lVar11 = lVar11 + 0x10;
            } while ((long)iVar4 << 4 != lVar11);
          }
          iVar1 = this->m_resample_dst_y;
          if (0 < (long)iVar1) {
            lVar11 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)*(ushort *)((long)&this->m_Pclist_y->n + lVar11);
              lVar11 = lVar11 + 0x10;
            } while ((long)iVar1 << 4 != lVar11);
            iVar13 = iVar13 * 4;
          }
          iVar14 = (iVar4 * iVar13) / 3 + this->m_resample_src_y * iVar12;
          iVar2 = this->m_resample_src_x;
          iVar12 = iVar1 * iVar12 + (iVar13 * iVar2) / 3;
          bVar3 = true;
          piVar7 = &this->m_resample_src_x;
          if ((iVar14 <= iVar12) &&
             (bVar3 = iVar2 < iVar4 && iVar14 == iVar12, iVar2 >= iVar4 || iVar14 != iVar12)) {
            piVar7 = &this->m_resample_dst_x;
          }
          this->m_delay_x_resample = bVar3;
          iVar4 = *piVar7;
          this->m_intermediate_x = iVar4;
          if (bVar3 == false) {
            return;
          }
          pSVar5 = (Sample *)crnlib_malloc((long)iVar4 << 2);
          this->m_Ptmp_buf = pSVar5;
          SVar10 = STATUS_OUT_OF_MEMORY;
          if (pSVar5 != (Sample *)0x0) {
            return;
          }
          goto LAB_00152c90;
        }
      }
    }
  }
LAB_00152c8b:
  SVar10 = STATUS_OUT_OF_MEMORY;
LAB_00152c90:
  this->m_status = SVar10;
  return;
}

Assistant:

Resampler::Resampler(int src_x, int src_y,
                     int dst_x, int dst_y,
                     Boundary_Op boundary_op,
                     Resample_Real sample_low, Resample_Real sample_high,
                     const char* Pfilter_name,
                     Contrib_List* Pclist_x,
                     Contrib_List* Pclist_y,
                     Resample_Real filter_x_scale,
                     Resample_Real filter_y_scale,
                     Resample_Real src_x_ofs,
                     Resample_Real src_y_ofs) {
  int i, j;
  Resample_Real support, (*func)(Resample_Real);

  resampler_assert(src_x > 0);
  resampler_assert(src_y > 0);
  resampler_assert(dst_x > 0);
  resampler_assert(dst_y > 0);

#if CRNLIB_RESAMPLER_DEBUG_OPS
  total_ops = 0;
#endif

  m_lo = sample_low;
  m_hi = sample_high;

  m_delay_x_resample = false;
  m_intermediate_x = 0;
  m_Pdst_buf = NULL;
  m_Ptmp_buf = NULL;
  m_clist_x_forced = false;
  m_Pclist_x = NULL;
  m_clist_y_forced = false;
  m_Pclist_y = NULL;
  m_Psrc_y_count = NULL;
  m_Psrc_y_flag = NULL;
  m_Pscan_buf = NULL;
  m_status = STATUS_OKAY;

  m_resample_src_x = src_x;
  m_resample_src_y = src_y;
  m_resample_dst_x = dst_x;
  m_resample_dst_y = dst_y;

  m_boundary_op = boundary_op;

  if ((m_Pdst_buf = (Sample*)crnlib_malloc(m_resample_dst_x * sizeof(Sample))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  // Find the specified filter.

  if (Pfilter_name == NULL)
    Pfilter_name = CRNLIB_RESAMPLER_DEFAULT_FILTER;

  for (i = 0; i < g_num_resample_filters; i++)
    if (strcmp(Pfilter_name, g_resample_filters[i].name) == 0)
      break;

  if (i == g_num_resample_filters) {
    m_status = STATUS_BAD_FILTER_NAME;
    return;
  }

  func = g_resample_filters[i].func;
  support = g_resample_filters[i].support;

  /* Create contributor lists, unless the user supplied custom lists. */

  if (!Pclist_x) {
    m_Pclist_x = make_clist(m_resample_src_x, m_resample_dst_x, m_boundary_op, func, support, filter_x_scale, src_x_ofs);
    if (!m_Pclist_x) {
      m_status = STATUS_OUT_OF_MEMORY;
      return;
    }
  } else {
    m_Pclist_x = Pclist_x;
    m_clist_x_forced = true;
  }

  if (!Pclist_y) {
    m_Pclist_y = make_clist(m_resample_src_y, m_resample_dst_y, m_boundary_op, func, support, filter_y_scale, src_y_ofs);
    if (!m_Pclist_y) {
      m_status = STATUS_OUT_OF_MEMORY;
      return;
    }
  } else {
    m_Pclist_y = Pclist_y;
    m_clist_y_forced = true;
  }

  if ((m_Psrc_y_count = (int*)crnlib_calloc(m_resample_src_y, sizeof(int))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  if ((m_Psrc_y_flag = (unsigned char*)crnlib_calloc(m_resample_src_y, sizeof(unsigned char))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  /* Count how many times each source line
      * contributes to a destination line.
      */

  for (i = 0; i < m_resample_dst_y; i++)
    for (j = 0; j < m_Pclist_y[i].n; j++)
      m_Psrc_y_count[resampler_range_check(m_Pclist_y[i].p[j].pixel, m_resample_src_y)]++;

  if ((m_Pscan_buf = (Scan_Buf*)crnlib_malloc(sizeof(Scan_Buf))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++) {
    m_Pscan_buf->scan_buf_y[i] = -1;
    m_Pscan_buf->scan_buf_l[i] = NULL;
  }

  m_cur_src_y = m_cur_dst_y = 0;
  {
    // Determine which axis to resample first by comparing the number of multiplies required
    // for each possibility.
    int x_ops = count_ops(m_Pclist_x, m_resample_dst_x);
    int y_ops = count_ops(m_Pclist_y, m_resample_dst_y);

    // Hack 10/2000: Weight Y axis ops a little more than X axis ops.
    // (Y axis ops use more cache resources.)
    int xy_ops = x_ops * m_resample_src_y +
                 (4 * y_ops * m_resample_dst_x) / 3;

    int yx_ops = (4 * y_ops * m_resample_src_x) / 3 +
                 x_ops * m_resample_dst_y;

#if CRNLIB_RESAMPLER_DEBUG_OPS
    printf("src: %i %i\n", m_resample_src_x, m_resample_src_y);
    printf("dst: %i %i\n", m_resample_dst_x, m_resample_dst_y);
    printf("x_ops: %i\n", x_ops);
    printf("y_ops: %i\n", y_ops);
    printf("xy_ops: %i\n", xy_ops);
    printf("yx_ops: %i\n", yx_ops);
#endif

    // Now check which resample order is better. In case of a tie, choose the order
    // which buffers the least amount of data.
    if ((xy_ops > yx_ops) ||
        ((xy_ops == yx_ops) && (m_resample_src_x < m_resample_dst_x))) {
      m_delay_x_resample = true;
      m_intermediate_x = m_resample_src_x;
    } else {
      m_delay_x_resample = false;
      m_intermediate_x = m_resample_dst_x;
    }
#if CRNLIB_RESAMPLER_DEBUG_OPS
    printf("delaying: %i\n", m_delay_x_resample);
#endif
  }

  if (m_delay_x_resample) {
    if ((m_Ptmp_buf = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == NULL) {
      m_status = STATUS_OUT_OF_MEMORY;
      return;
    }
  }
}